

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3ExprAddCollateToken(Parse *pParse,Expr *pExpr,Token *pCollName,int dequote)

{
  byte *pbVar1;
  Expr *pEVar2;
  
  if (pCollName->n != 0) {
    pEVar2 = sqlite3ExprAlloc(pParse->db,0x6a,pCollName,dequote);
    if (pEVar2 != (Expr *)0x0) {
      pEVar2->pLeft = pExpr;
      pbVar1 = (byte *)((long)&pEVar2->flags + 1);
      *pbVar1 = *pbVar1 | 0x11;
      pExpr = pEVar2;
    }
  }
  return pExpr;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAddCollateToken(
  Parse *pParse,           /* Parsing context */
  Expr *pExpr,             /* Add the "COLLATE" clause to this expression */
  const Token *pCollName,  /* Name of collating sequence */
  int dequote              /* True to dequote pCollName */
){
  if( pCollName->n>0 ){
    Expr *pNew = sqlite3ExprAlloc(pParse->db, TK_COLLATE, pCollName, dequote);
    if( pNew ){
      pNew->pLeft = pExpr;
      pNew->flags |= EP_Collate|EP_Skip;
      pExpr = pNew;
    }
  }
  return pExpr;
}